

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::DebugNodeTable(ImGuiTable *table)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  uint uVar4;
  float fVar5;
  char *pcVar6;
  ImGuiTableColumn *pIVar7;
  ImGuiTableSettings *pIVar8;
  uint *in_RDI;
  char *this;
  float fVar9;
  float fVar10;
  ImVec2 *size_arg;
  double dVar11;
  char *label;
  ImGuiTableSettings *settings;
  ImRect r;
  char *name;
  ImGuiTableColumn *column;
  int n_1;
  int n;
  float sum_weights;
  bool clear_settings;
  bool open;
  bool is_active;
  char *buf_end;
  char *p;
  char buf [512];
  float in_stack_fffffffffffffb94;
  float in_stack_fffffffffffffb98;
  float in_stack_fffffffffffffb9c;
  ImGuiHoveredFlags in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  ImGuiCol in_stack_fffffffffffffbb4;
  ImGuiTableSettings *in_stack_fffffffffffffbe0;
  float in_stack_fffffffffffffc10;
  ImDrawFlags in_stack_fffffffffffffc14;
  undefined8 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  ImGuiID IVar12;
  undefined4 in_stack_fffffffffffffc24;
  undefined4 in_stack_fffffffffffffc28;
  ImGuiTableColumnFlags IVar13;
  undefined4 in_stack_fffffffffffffc2c;
  ImDrawList *in_stack_fffffffffffffc30;
  char *pcVar14;
  float local_344;
  ImVec2 local_288;
  char *local_280;
  ImGuiTableColumn *local_278;
  uint local_26c;
  int local_268;
  float local_264;
  byte local_25d;
  ImVec2 local_25c;
  ImVec2 local_254;
  byte local_24a;
  byte local_249;
  uint **local_248;
  char *local_240;
  char local_238 [512];
  uint *local_38;
  
  local_240 = local_238;
  local_248 = &local_38;
  uVar4 = in_RDI[0x1c];
  local_38 = in_RDI;
  iVar2 = GetFrameCount();
  local_249 = iVar2 + -2 <= (int)uVar4;
  pcVar6 = " *Inactive*";
  if ((bool)local_249) {
    pcVar6 = "";
  }
  ImFormatString(local_240,(long)local_248 - (long)local_240,
                 "Table 0x%08X (%d columns, in \'%s\')%s",(ulong)*local_38,(ulong)local_38[0x1d],
                 **(undefined8 **)(local_38 + 0x60),pcVar6);
  if ((local_249 & 1) == 0) {
    GetStyleColorVec4(1);
    PushStyleColor(in_stack_fffffffffffffbb4,
                   (ImVec4 *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  }
  local_24a = TreeNode(local_38,"%s",local_238);
  if ((local_249 & 1) == 0) {
    PopStyleColor((int)in_stack_fffffffffffffb94);
  }
  bVar1 = IsItemHovered(in_stack_fffffffffffffba0);
  if (bVar1) {
    GetForegroundDrawList();
    ImDrawList::AddRect(in_stack_fffffffffffffc30,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                        (ImU32)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                        (float)in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,
                        in_stack_fffffffffffffc10);
  }
  bVar1 = IsItemVisible();
  if ((bVar1) && ((char)local_38[0x7d] != -1)) {
    GetForegroundDrawList();
    local_254 = GetItemRectMin();
    local_25c = GetItemRectMax();
    ImDrawList::AddRect(in_stack_fffffffffffffc30,
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                        (ImVec2 *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                        (ImU32)((ulong)in_stack_fffffffffffffc18 >> 0x20),
                        (float)in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,
                        in_stack_fffffffffffffc10);
  }
  if ((local_24a & 1) != 0) {
    if (0 < (short)local_38[0x20]) {
      Text("** %d instances of same table! Some data below will refer to last instance.",
           (ulong)((int)(short)local_38[0x20] + 1));
    }
    local_25d = SmallButton((char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
    fVar3 = (float)local_38[0x3c];
    fVar5 = (float)local_38[0x3d];
    fVar9 = ImRect::GetWidth((ImRect *)(local_38 + 0x3c));
    fVar10 = ImRect::GetHeight((ImRect *)(local_38 + 0x3c));
    pcVar6 = DebugNodeTableGetSizingPolicyDesc(local_38[1]);
    BulletText((char *)(double)fVar3,(double)fVar5,(double)fVar9,(double)fVar10,
               "OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: \'%s\'",pcVar6);
    pcVar6 = "";
    if ((float)local_38[0x35] == 0.0) {
      pcVar6 = " (auto)";
    }
    BulletText((char *)(double)(float)local_38[0x36],(double)(float)local_38[0x37],
               (double)(float)local_38[0x35],
               "ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s",pcVar6);
    BulletText((char *)(double)(float)local_38[0x31],(double)(float)local_38[0x33],
               (double)(float)local_38[0x34],(double)(float)local_38[0x30],
               "CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f");
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d",
               (ulong)(uint)(int)(char)local_38[0x7d],
               (ulong)(uint)(int)*(char *)((long)local_38 + 0x1f5));
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d",
               (ulong)(uint)(int)*(char *)((long)local_38 + 0x1f7),
               (ulong)(uint)(int)*(char *)((long)local_38 + 0x1fa),
               (ulong)(uint)(int)*(char *)((long)local_38 + 0x1f9));
    local_264 = 0.0;
    for (local_268 = 0; local_268 < (int)local_38[0x1d]; local_268 = local_268 + 1) {
      pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)(local_38 + 6),local_268);
      if ((pIVar7->Flags & 8U) != 0) {
        pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)(local_38 + 6),local_268);
        local_264 = pIVar7->StretchWeight + local_264;
      }
    }
    for (local_26c = 0; (int)local_26c < (int)local_38[0x1d]; local_26c = local_26c + 1) {
      local_278 = ImSpan<ImGuiTableColumn>::operator[]
                            ((ImSpan<ImGuiTableColumn> *)(local_38 + 6),local_26c);
      local_280 = TableGetColumnName((ImGuiTable *)
                                     CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                                     (int)in_stack_fffffffffffffb94);
      pcVar6 = "";
      if ((int)local_26c < (int)*(char *)((long)local_38 + 0x203)) {
        pcVar6 = " (Frozen)";
      }
      fVar3 = (float)(uint)(local_278->IsEnabled & 1);
      in_stack_fffffffffffffb98 = (float)(uint)(local_278->IsVisibleX & 1);
      uVar4 = (uint)(local_278->IsVisibleY & 1);
      if (local_278->StretchWeight <= 0.0) {
        local_344 = 0.0;
      }
      else {
        local_344 = (local_278->StretchWeight / local_264) * 100.0;
      }
      size_arg = (ImVec2 *)(double)local_278->MinX;
      dVar11 = (double)local_278->MaxX;
      label = (char *)(double)(local_278->MaxX - local_278->MinX);
      in_stack_fffffffffffffbe0 = (ImGuiTableSettings *)(double)(local_278->ClipRect).Max.x;
      fVar5 = (float)(int)local_278->SortOrder;
      if ((local_278->field_0x65 & 3) == 1) {
        pcVar14 = " (Asc)";
      }
      else {
        pcVar14 = "";
        if ((local_278->field_0x65 & 3) == 2) {
          pcVar14 = " (Des)";
        }
      }
      IVar12 = local_278->UserID;
      IVar13 = local_278->Flags;
      this = "";
      if ((local_278->Flags & 8U) != 0) {
        this = "WidthStretch ";
      }
      ImFormatString((char *)(double)(local_278->MinX - (float)local_38[0x44]),
                     (size_t)(double)(local_278->MaxX - (float)local_38[0x44]),
                     (char *)(double)local_278->WidthGiven,(double)local_278->WidthRequest,
                     (double)local_278->WidthAuto,(double)local_278->StretchWeight,(double)local_344
                     ,size_arg,local_238,0x200,
                     "Column %d order %d \'%s\': offset %+.2f to %+.2f%s\nEnabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\nWidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\nMinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\nContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\nSort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s.."
                     ,(ulong)local_26c,(ulong)(uint)(int)local_278->DisplayOrder,local_280,pcVar6);
      Bullet();
      ImVec2::ImVec2(&local_288,0.0,0.0);
      Selectable(label,SUB81((ulong)dVar11 >> 0x38,0),SUB84(dVar11,0),size_arg);
      bVar1 = IsItemHovered(uVar4);
      if (bVar1) {
        ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffba4,uVar4),in_stack_fffffffffffffb9c
                       ,in_stack_fffffffffffffb98,in_stack_fffffffffffffb94,fVar3);
        GetForegroundDrawList();
        ImDrawList::AddRect((ImDrawList *)this,(ImVec2 *)CONCAT44(in_stack_fffffffffffffc2c,IVar13),
                            (ImVec2 *)CONCAT44(in_stack_fffffffffffffc24,IVar12),
                            (ImU32)((ulong)pcVar14 >> 0x20),SUB84(pcVar14,0),
                            in_stack_fffffffffffffc14,fVar5);
      }
    }
    pIVar8 = TableGetBoundSettings
                       ((ImGuiTable *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98))
    ;
    if (pIVar8 != (ImGuiTableSettings *)0x0) {
      DebugNodeTableSettings(in_stack_fffffffffffffbe0);
    }
    if ((local_25d & 1) != 0) {
      *(undefined1 *)((long)local_38 + 0x212) = 1;
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTable(ImGuiTable* table)
{
    char buf[512];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (table->LastFrameActive >= ImGui::GetFrameCount() - 2); // Note that fully clipped early out scrolling tables will appear as inactive here.
    ImFormatString(p, buf_end - p, "Table 0x%08X (%d columns, in '%s')%s", table->ID, table->ColumnsCount, table->OuterWindow->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(table, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered())
        GetForegroundDrawList()->AddRect(table->OuterRect.Min, table->OuterRect.Max, IM_COL32(255, 255, 0, 255));
    if (IsItemVisible() && table->HoveredColumnBody != -1)
        GetForegroundDrawList()->AddRect(GetItemRectMin(), GetItemRectMax(), IM_COL32(255, 255, 0, 255));
    if (!open)
        return;
    if (table->InstanceCurrent > 0)
        ImGui::Text("** %d instances of same table! Some data below will refer to last instance.", table->InstanceCurrent + 1);
    bool clear_settings = SmallButton("Clear settings");
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: '%s'", table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.GetWidth(), table->OuterRect.GetHeight(), DebugNodeTableGetSizingPolicyDesc(table->Flags));
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s", table->ColumnsGivenWidth, table->ColumnsAutoFitWidth, table->InnerWidth, table->InnerWidth == 0.0f ? " (auto)" : "");
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f", table->CellPaddingX, table->CellSpacingX1, table->CellSpacingX2, table->OuterPaddingX);
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d", table->HoveredColumnBody, table->HoveredColumnBorder);
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d", table->ResizedColumn, table->ReorderColumn, table->HeldHeaderColumn);
    //BulletText("BgDrawChannels: %d/%d", 0, table->BgDrawChannelUnfrozen);
    float sum_weights = 0.0f;
    for (int n = 0; n < table->ColumnsCount; n++)
        if (table->Columns[n].Flags & ImGuiTableColumnFlags_WidthStretch)
            sum_weights += table->Columns[n].StretchWeight;
    for (int n = 0; n < table->ColumnsCount; n++)
    {
        ImGuiTableColumn* column = &table->Columns[n];
        const char* name = TableGetColumnName(table, n);
        ImFormatString(buf, IM_ARRAYSIZE(buf),
            "Column %d order %d '%s': offset %+.2f to %+.2f%s\n"
            "Enabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\n"
            "WidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\n"
            "MinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\n"
            "ContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\n"
            "Sort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s..",
            n, column->DisplayOrder, name, column->MinX - table->WorkRect.Min.x, column->MaxX - table->WorkRect.Min.x, (n < table->FreezeColumnsRequest) ? " (Frozen)" : "",
            column->IsEnabled, column->IsVisibleX, column->IsVisibleY, column->IsRequestOutput, column->IsSkipItems, column->DrawChannelFrozen, column->DrawChannelUnfrozen,
            column->WidthGiven, column->WidthRequest, column->WidthAuto, column->StretchWeight, column->StretchWeight > 0.0f ? (column->StretchWeight / sum_weights) * 100.0f : 0.0f,
            column->MinX, column->MaxX, column->MaxX - column->MinX, column->ClipRect.Min.x, column->ClipRect.Max.x, column->ClipRect.Max.x - column->ClipRect.Min.x,
            column->ContentMaxXFrozen - column->WorkMinX, column->ContentMaxXUnfrozen - column->WorkMinX, column->ContentMaxXHeadersUsed - column->WorkMinX, column->ContentMaxXHeadersIdeal - column->WorkMinX,
            column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? " (Asc)" : (column->SortDirection == ImGuiSortDirection_Descending) ? " (Des)" : "", column->UserID, column->Flags,
            (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? "WidthStretch " : "",
            (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? "WidthFixed " : "",
            (column->Flags & ImGuiTableColumnFlags_NoResize) ? "NoResize " : "");
        Bullet();
        Selectable(buf);
        if (IsItemHovered())
        {
            ImRect r(column->MinX, table->OuterRect.Min.y, column->MaxX, table->OuterRect.Max.y);
            GetForegroundDrawList()->AddRect(r.Min, r.Max, IM_COL32(255, 255, 0, 255));
        }
    }
    if (ImGuiTableSettings* settings = TableGetBoundSettings(table))
        DebugNodeTableSettings(settings);
    if (clear_settings)
        table->IsResetAllRequest = true;
    TreePop();
}